

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

int sat_solver_push(sat_solver *s,int p)

{
  veci *v;
  clause *pcVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  clause e;
  
  iVar4 = p >> 1;
  if (iVar4 < s->size) {
    veci_push(&s->trail_lim,s->qtail);
    s->root_level = s->root_level + 1;
    iVar2 = sat_solver_enqueue(s,p,0);
    if (iVar2 == 0) {
      uVar3 = s->reasons[iVar4];
      e = (clause)(p ^ 1);
      if (uVar3 == 0) {
        v = &s->conf_final;
        uVar3 = 0;
        veci_resize(v,0);
        veci_push(v,(int)e);
        if (0 < s->levels[iVar4]) {
          veci_push(v,p);
        }
      }
      else {
        if ((uVar3 & 1) != 0) {
          pcVar1 = s->binary;
          pcVar1[2] = e;
          pcVar1[1] = (clause)((int)uVar3 >> 1);
          uVar3 = s->hBinary;
        }
        sat_solver_analyze_final(s,uVar3,1);
        veci_push(&s->conf_final,(int)e);
        uVar3 = 0;
      }
    }
    else {
      iVar4 = sat_solver_propagate(s);
      if (iVar4 != 0) {
        sat_solver_analyze_final(s,iVar4,0);
      }
      uVar3 = (uint)(iVar4 == 0);
    }
    return uVar3;
  }
  __assert_fail("lit_var(p) < s->size",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.c"
                ,0x6ef,"int sat_solver_push(sat_solver *, int)");
}

Assistant:

int sat_solver_push(sat_solver* s, int p)
{
    assert(lit_var(p) < s->size);
    veci_push(&s->trail_lim,s->qtail);
    s->root_level++;
    if (!sat_solver_enqueue(s,p,0))
    {
        int h = s->reasons[lit_var(p)];
        if (h)
        {
            if (clause_is_lit(h))
            {
                (clause_begin(s->binary))[1] = lit_neg(p);
                (clause_begin(s->binary))[0] = clause_read_lit(h);
                h = s->hBinary;
            }
            sat_solver_analyze_final(s, h, 1);
            veci_push(&s->conf_final, lit_neg(p));
        }
        else
        {
            veci_resize(&s->conf_final,0);
            veci_push(&s->conf_final, lit_neg(p));
            // the two lines below are a bug fix by Siert Wieringa 
            if (var_level(s, lit_var(p)) > 0)
                veci_push(&s->conf_final, p);
        }
        //sat_solver_canceluntil(s, 0);
        return false; 
    }
    else
    {
        int fConfl = sat_solver_propagate(s);
        if (fConfl){
            sat_solver_analyze_final(s, fConfl, 0);
            //assert(s->conf_final.size > 0);
            //sat_solver_canceluntil(s, 0);
            return false; }
    }
    return true;
}